

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

void CorUnix::CPalSynchronizationManager::UnmarkTWListForDelegatedObjectSignalingInProgress
               (CSynchData *pTgtObjectSynchData)

{
  ObjectDomain OVar1;
  _WaitingThreadsListNode *p_Var2;
  
  OVar1 = pTgtObjectSynchData->m_odObjectDomain;
  if (OVar1 == SharedObject) {
    p_Var2 = (_WaitingThreadsListNode *)SHMPtrToPtr((pTgtObjectSynchData->m_ptrWTLHead).shrid);
  }
  else {
    p_Var2 = (pTgtObjectSynchData->m_ptrWTLHead).ptr;
  }
  while (p_Var2 != (_WaitingThreadsListNode *)0x0) {
    *(byte *)&p_Var2->dwFlags = (byte)p_Var2->dwFlags & 0xfb;
    if (OVar1 == SharedObject) {
      p_Var2 = (_WaitingThreadsListNode *)SHMPtrToPtr((p_Var2->ptrNext).shrid);
    }
    else {
      p_Var2 = (p_Var2->ptrNext).ptr;
    }
  }
  return;
}

Assistant:

void CPalSynchronizationManager::UnmarkTWListForDelegatedObjectSignalingInProgress(
        CSynchData * pTgtObjectSynchData)
    {
        bool fSharedObject = (SharedObject == pTgtObjectSynchData->GetObjectDomain());
        WaitingThreadsListNode * pwtlnNode;

        VALIDATEOBJECT(pTgtObjectSynchData);

        pwtlnNode =  fSharedObject ?
            SharedIDToTypePointer(WaitingThreadsListNode,
                pTgtObjectSynchData->GetWTLHeadShmPtr()) :
                pTgtObjectSynchData->GetWTLHeadPtr();
        while (pwtlnNode)
        {
            VALIDATEOBJECT(pwtlnNode);

            pwtlnNode->dwFlags &= ~WTLN_FLAG_DELEGATED_OBJECT_SIGNALING_IN_PROGRESS;

            pwtlnNode = fSharedObject ?
                SharedIDToTypePointer(WaitingThreadsListNode,
                    pwtlnNode->ptrNext.shrid) :
                    pwtlnNode->ptrNext.ptr;
        }
    }